

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O0

FILE * fopen(char *__filename,char *__modes)

{
  uint uVar1;
  _PDCLIB_fd_t _Var2;
  char *pcVar3;
  uint filemode;
  _PDCLIB_file_t *rc;
  char *mode_local;
  char *filename_local;
  
  uVar1 = _PDCLIB_filemode(__modes);
  if (uVar1 == 0) {
    filename_local = (char *)0x0;
  }
  else if ((__filename == (char *)0x0) || (*__filename == '\0')) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)_PDCLIB_init_file_t((_PDCLIB_file_t *)0x0);
    if ((_PDCLIB_file_t *)filename_local == (_PDCLIB_file_t *)0x0) {
      filename_local = (char *)0x0;
    }
    else {
      ((_PDCLIB_file_t *)filename_local)->status =
           uVar1 | 2 | ((_PDCLIB_file_t *)filename_local)->status;
      _Var2 = _PDCLIB_open(__filename,((_PDCLIB_file_t *)filename_local)->status);
      ((_PDCLIB_file_t *)filename_local)->handle = _Var2;
      if (_Var2 == -1) {
        mtx_destroy(&((_PDCLIB_file_t *)filename_local)->mtx);
        free(((_PDCLIB_file_t *)filename_local)->buffer);
        free(filename_local);
        filename_local = (char *)0x0;
      }
      else {
        pcVar3 = _PDCLIB_realpath(__filename);
        ((_PDCLIB_file_t *)filename_local)->filename = pcVar3;
        mtx_lock(&_PDCLIB_filelist_mtx);
        ((_PDCLIB_file_t *)filename_local)->next = _PDCLIB_filelist;
        _PDCLIB_filelist = (_PDCLIB_file_t *)filename_local;
        mtx_unlock(&_PDCLIB_filelist_mtx);
      }
    }
  }
  return (FILE *)filename_local;
}

Assistant:

struct _PDCLIB_file_t * fopen( const char * _PDCLIB_restrict filename, const char * _PDCLIB_restrict mode )
{
    struct _PDCLIB_file_t * rc;
    unsigned int filemode = _PDCLIB_filemode( mode );

    if ( filemode == 0 )
    {
        /* mode invalid */
        return NULL;
    }

    if ( filename == NULL || filename[0] == '\0' )
    {
        /* filename invalid */
        return NULL;
    }

    /* See tmpfile(), which does much of the same. */

    if ( ( rc = _PDCLIB_init_file_t( NULL ) ) == NULL )
    {
        /* initializing FILE structure failed */
        return NULL;
    }

    /* Setting buffer to _IOLBF because "when opened, a stream is fully
       buffered if and only if it can be determined not to refer to an
       interactive device."
    */
    rc->status |= filemode | _IOLBF;

    if ( ( rc->handle = _PDCLIB_open( filename, rc->status ) ) == _PDCLIB_NOHANDLE )
    {
        /* OS open() failed */
#ifndef __STDC_NO_THREADS__
        mtx_destroy( &rc->mtx );
#endif
        free( rc->buffer );
        free( rc );
        return NULL;
    }

    /* Getting absolute filename (for potential freopen()) */
    rc->filename = _PDCLIB_realpath( filename );

    /* Adding to list of open files */
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );
    rc->next = _PDCLIB_filelist;
    _PDCLIB_filelist = rc;
    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    return rc;
}